

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::BasicTexSubImageCubeCase::createTexture(BasicTexSubImageCubeCase *this)

{
  deUint32 dVar1;
  deUint32 dVar2;
  float fVar3;
  float xoffset;
  int iVar4;
  int iVar5;
  deUint32 dVar6;
  int width;
  int height;
  char *str;
  void *pvVar7;
  int local_21c;
  PixelBufferAccess local_210;
  PixelBufferAccess local_1e8;
  int local_1bc;
  int cellSize;
  Vector<float,_4> local_1a8;
  undefined1 local_198 [8];
  Vec4 colorB;
  Vector<float,_4> local_178;
  undefined1 local_168 [8];
  Vec4 colorA;
  int y;
  int x;
  int h;
  int w;
  int face_1;
  int levelH_1;
  int levelW_1;
  int ndx_1;
  PixelBufferAccess local_110;
  Vector<float,_4> local_e4;
  Vector<float,_4> local_d4;
  undefined1 local_c4 [8];
  Vec4 gMax;
  Vector<float,_4> local_a4;
  undefined1 local_94 [8];
  Vec4 gMin;
  int face;
  int levelH;
  int levelW;
  int ndx;
  undefined1 local_68 [8];
  Random rnd;
  TextureLevel data;
  deUint32 tex;
  int numLevels;
  TextureFormat fmt;
  BasicTexSubImageCubeCase *this_local;
  
  _tex = (this->super_TextureSpecCase).m_texFormat;
  fmt = (TextureFormat)this;
  if (((this->super_TextureSpecCase).m_flags & 1) == 0) {
    local_21c = 1;
  }
  else {
    iVar4 = deLog2Floor32((this->super_TextureSpecCase).m_width);
    iVar5 = deLog2Floor32((this->super_TextureSpecCase).m_height);
    local_21c = de::max<int>(iVar4,iVar5);
    local_21c = local_21c + 1;
  }
  data.m_data.m_cap._4_4_ = local_21c;
  data.m_data.m_cap._0_4_ = 0;
  tcu::TextureLevel::TextureLevel((TextureLevel *)&rnd.m_rnd.z,(TextureFormat *)&tex);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar6 = deStringHash(str);
  de::Random::Random((Random *)local_68,dVar6);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_TextureSpecCase).super_ContextWrapper,1,(deUint32 *)&data.m_data.m_cap);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_TextureSpecCase).super_ContextWrapper,0x8513,(deUint32)data.m_data.m_cap)
  ;
  sglr::ContextWrapper::glPixelStorei(&(this->super_TextureSpecCase).super_ContextWrapper,0xcf5,1);
  for (levelH = 0; levelH < data.m_data.m_cap._4_4_; levelH = levelH + 1) {
    iVar4 = de::max<int>(1,(this->super_TextureSpecCase).m_width >> ((byte)levelH & 0x1f));
    gMin.m_data[3] =
         (float)de::max<int>(1,(this->super_TextureSpecCase).m_height >> ((byte)levelH & 0x1f));
    tcu::TextureLevel::setSize((TextureLevel *)&rnd.m_rnd.z,iVar4,(int)gMin.m_data[3],1);
    for (gMin.m_data[2] = 0.0; (int)gMin.m_data[2] < 6;
        gMin.m_data[2] = (float)((int)gMin.m_data[2] + 1)) {
      tcu::Vector<float,_4>::Vector(&local_a4,0.0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(gMax.m_data + 2),1.0);
      randomVector<4>((Functional *)local_94,(Random *)local_68,&local_a4,
                      (Vector<float,_4> *)(gMax.m_data + 2));
      tcu::Vector<float,_4>::Vector(&local_d4,0.0);
      tcu::Vector<float,_4>::Vector(&local_e4,1.0);
      randomVector<4>((Functional *)local_c4,(Random *)local_68,&local_d4,&local_e4);
      tcu::TextureLevel::getAccess(&local_110,(TextureLevel *)&rnd.m_rnd.z);
      tcu::fillWithComponentGradients(&local_110,(Vec4 *)local_94,(Vec4 *)local_c4);
      fVar3 = gMin.m_data[3];
      dVar6 = *(deUint32 *)(s_cubeMapFaces + (long)(int)gMin.m_data[2] * 4);
      dVar1 = this->m_format;
      dVar2 = this->m_dataType;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&levelW_1,(TextureLevel *)&rnd.m_rnd.z);
      pvVar7 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)&levelW_1);
      sglr::ContextWrapper::glTexImage2D
                (&(this->super_TextureSpecCase).super_ContextWrapper,dVar6,levelH,dVar1,iVar4,
                 (int)fVar3,0,dVar1,dVar2,pvVar7);
    }
  }
  for (levelH_1 = 0; levelH_1 < data.m_data.m_cap._4_4_; levelH_1 = levelH_1 + 1) {
    iVar4 = de::max<int>(1,(this->super_TextureSpecCase).m_width >> ((byte)levelH_1 & 0x1f));
    iVar5 = de::max<int>(1,(this->super_TextureSpecCase).m_height >> ((byte)levelH_1 & 0x1f));
    for (h = 0; h < 6; h = h + 1) {
      width = de::Random::getInt((Random *)local_68,1,iVar4);
      height = de::Random::getInt((Random *)local_68,1,iVar5);
      colorA.m_data[3] = (float)de::Random::getInt((Random *)local_68,0,iVar4 - width);
      colorA.m_data[2] = (float)de::Random::getInt((Random *)local_68,0,iVar5 - height);
      tcu::Vector<float,_4>::Vector(&local_178,0.0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colorB.m_data + 2),1.0);
      randomVector<4>((Functional *)local_168,(Random *)local_68,&local_178,
                      (Vector<float,_4> *)(colorB.m_data + 2));
      tcu::Vector<float,_4>::Vector(&local_1a8,0.0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xfffffffffffffe48,1.0);
      randomVector<4>((Functional *)local_198,(Random *)local_68,&local_1a8,
                      (Vector<float,_4> *)&stack0xfffffffffffffe48);
      local_1bc = de::Random::getInt((Random *)local_68,2,0x10);
      tcu::TextureLevel::setSize((TextureLevel *)&rnd.m_rnd.z,width,height,1);
      tcu::TextureLevel::getAccess(&local_1e8,(TextureLevel *)&rnd.m_rnd.z);
      tcu::fillWithGrid(&local_1e8,local_1bc,(Vec4 *)local_168,(Vec4 *)local_198);
      xoffset = colorA.m_data[3];
      fVar3 = colorA.m_data[2];
      dVar6 = *(deUint32 *)(s_cubeMapFaces + (long)h * 4);
      dVar1 = this->m_format;
      dVar2 = this->m_dataType;
      tcu::TextureLevel::getAccess(&local_210,(TextureLevel *)&rnd.m_rnd.z);
      pvVar7 = tcu::PixelBufferAccess::getDataPtr(&local_210);
      sglr::ContextWrapper::glTexSubImage2D
                (&(this->super_TextureSpecCase).super_ContextWrapper,dVar6,levelH_1,(int)xoffset,
                 (int)fVar3,width,height,dVar1,dVar2,pvVar7);
    }
  }
  de::Random::~Random((Random *)local_68);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&rnd.m_rnd.z);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	data		(fmt);
		de::Random			rnd			(deStringHash(getName()));

		DE_ASSERT(m_width == m_height); // Non-square cubemaps are not supported by GLES2.

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			data.setSize(levelW, levelH);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				Vec4 gMin = randomVector<4>(rnd);
				Vec4 gMax = randomVector<4>(rnd);

				tcu::fillWithComponentGradients(data.getAccess(), gMin, gMax);

				glTexImage2D(s_cubeMapFaces[face], ndx, m_format, levelW, levelH, 0, m_format, m_dataType, data.getAccess().getDataPtr());
			}
		}

		// Re-specify parts of each face and level.
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				int		w			= rnd.getInt(1, levelW);
				int		h			= rnd.getInt(1, levelH);
				int		x			= rnd.getInt(0, levelW-w);
				int		y			= rnd.getInt(0, levelH-h);

				Vec4	colorA		= randomVector<4>(rnd);
				Vec4	colorB		= randomVector<4>(rnd);
				int		cellSize	= rnd.getInt(2, 16);

				data.setSize(w, h);
				tcu::fillWithGrid(data.getAccess(), cellSize, colorA, colorB);

				glTexSubImage2D(s_cubeMapFaces[face], ndx, x, y, w, h, m_format, m_dataType, data.getAccess().getDataPtr());
			}
		}
	}